

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O2

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Matrix<float,-1,1,0,-1,1>,1>::
applyThisOnTheLeft<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,1,_1,1,1,_1>>
          (HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>
           *this,Matrix<float,__1,__1,_0,__1,__1> *dst,Matrix<float,_1,__1,_1,_1,__1> *workspace,
          bool inputIsIdentity)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long cRows;
  long lVar5;
  Index IVar6;
  Index k;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long local_e8;
  SubVectorsType sub_vecs1;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> sub_dst;
  VectorBlock<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> local_68;
  
  bVar1 = ((byte)this[0x10] ^ 1) & inputIsIdentity;
  uVar2 = *(ulong *)(this + 0x18);
  IVar6 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (IVar6 < 2 || (long)uVar2 < 0x30) {
    PlainObjectBase<Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>::resize
              (&workspace->super_PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,IVar6);
    lVar9 = -1;
    for (lVar7 = 0; lVar7 < *(long *)(this + 0x18); lVar7 = lVar7 + 1) {
      lVar4 = *(long *)(this + 0x18) + lVar9;
      if (this[0x10] !=
          (HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>
           )0x0) {
        lVar4 = lVar7;
      }
      cRows = *(long *)(*(long *)this + 8) - (*(long *)(this + 0x20) + lVar4);
      lVar5 = cRows;
      if (bVar1 == 0) {
        lVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols;
      }
      DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                ((Type *)&sub_vecs1,dst,cRows,lVar5);
      HouseholderSequence<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>
      ::essentialVector((EssentialVectorType *)&sub_dst,
                        (HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>
                         *)this,lVar4);
      MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,false>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>> *)
                 &sub_vecs1,
                 (Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_false> *)&sub_dst,
                 (Scalar *)(lVar4 * 4 + **(long **)(this + 8)),
                 (workspace->super_PlainObjectBase<Eigen::Matrix<float,_1,__1,_1,_1,__1>_>).
                 m_storage.m_data);
      lVar9 = lVar9 + -1;
    }
  }
  else {
    uVar3 = 0x30;
    if (uVar2 < 0x60) {
      uVar3 = (ulong)((int)uVar2 + 1U >> 1 & 0x7f);
    }
    local_e8 = 0;
    while (uVar8 = uVar2 - local_e8, uVar8 != 0 && local_e8 <= (long)uVar2) {
      if (this[0x10] ==
          (HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>
           )0x1) {
        lVar9 = local_e8;
        uVar8 = uVar2;
        if ((long)(uVar3 + local_e8) < (long)uVar2) {
          uVar8 = uVar3 + local_e8;
        }
      }
      else {
        lVar9 = uVar8 - uVar3;
        if ((long)(uVar8 - uVar3) < 1) {
          lVar9 = 0;
        }
      }
      local_e8 = uVar3 + local_e8;
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&sub_vecs1,*(Matrix<float,__1,__1,_0,__1,__1> **)this,
                 *(long *)(this + 0x20) + lVar9,lVar9,
                 ((*(Matrix<float,__1,__1,_0,__1,__1> **)this)->
                 super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows -
                 (*(long *)(this + 0x20) + lVar9),uVar8 - lVar9);
      lVar4 = ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows + *(long *)(this + 0x20) + lVar9) - *(long *)(*(long *)this + 8);
      lVar5 = *(long *)(*(long *)this + 8) - (*(long *)(this + 0x20) + lVar9);
      lVar7 = lVar4;
      IVar6 = lVar5;
      if (bVar1 == 0) {
        IVar6 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols;
        lVar7 = 0;
      }
      Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&sub_dst,dst,lVar4,lVar7,lVar5,IVar6);
      VectorBlock<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                (&local_68,*(Matrix<float,__1,_1,_0,__1,_1> **)(this + 8),lVar9,uVar8 - lVar9);
      internal::
      apply_block_householder_on_the_left<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>const,_1>>
                (&sub_dst,&sub_vecs1,&local_68,(bool)((byte)this[0x10] ^ 1));
      uVar2 = *(ulong *)(this + 0x18);
    }
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace, bool inputIsIdentity = false) const
    {
      if(inputIsIdentity && m_reverse)
        inputIsIdentity = false;
      // if the entries are large enough, then apply the reflectors by block
      if(m_length>=BlockSize && dst.cols()>1)
      {
        // Make sure we have at least 2 useful blocks, otherwise it is point-less:
        Index blockSize = m_length<Index(2*BlockSize) ? (m_length+1)/2 : Index(BlockSize);
        for(Index i = 0; i < m_length; i+=blockSize)
        {
          Index end = m_reverse ? (std::min)(m_length,i+blockSize) : m_length-i;
          Index k = m_reverse ? i : (std::max)(Index(0),end-blockSize);
          Index bs = end-k;
          Index start = k + m_shift;

          typedef Block<typename internal::remove_all<VectorsType>::type,Dynamic,Dynamic> SubVectorsType;
          SubVectorsType sub_vecs1(m_vectors.const_cast_derived(), Side==OnTheRight ? k : start,
                                                                   Side==OnTheRight ? start : k,
                                                                   Side==OnTheRight ? bs : m_vectors.rows()-start,
                                                                   Side==OnTheRight ? m_vectors.cols()-start : bs);
          typename internal::conditional<Side==OnTheRight, Transpose<SubVectorsType>, SubVectorsType&>::type sub_vecs(sub_vecs1);

          Index dstStart = dst.rows()-rows()+m_shift+k;
          Index dstRows  = rows()-m_shift-k;
          Block<Dest,Dynamic,Dynamic> sub_dst(dst,
                                              dstStart,
                                              inputIsIdentity ? dstStart : 0,
                                              dstRows,
                                              inputIsIdentity ? dstRows : dst.cols());
          apply_block_householder_on_the_left(sub_dst, sub_vecs, m_coeffs.segment(k, bs), !m_reverse);
        }
      }
      else
      {
        workspace.resize(dst.cols());
        for(Index k = 0; k < m_length; ++k)
        {
          Index actual_k = m_reverse ? k : m_length-k-1;
          Index dstStart = rows()-m_shift-actual_k;
          dst.bottomRightCorner(dstStart, inputIsIdentity ? dstStart : dst.cols())
            .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
        }
      }
    }